

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

int Abc_NtkFinRefinement
              (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
              Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Wec_t *vResult)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *__ptr;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar3;
  Vec_Wrd_t *vSims;
  word *__s;
  int *__s_00;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int nWords;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  int local_e4;
  int Types [2];
  int Objs [2];
  
  p = (Vec_Wec_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pVVar3 = (Vec_Int_t *)calloc(100,0x10);
  p->pArray = pVVar3;
  nWords = ((vList->nSize >> 6) + 1) - (uint)((vList->nSize & 0x3fU) == 0);
  pVVar2 = pNtk->vObjs;
  lVar15 = (long)nWords * (long)pVVar2->nSize;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar10 = (int)lVar15;
  iVar12 = iVar10;
  if (iVar10 - 1U < 0xf) {
    iVar12 = 0x10;
  }
  vSims->nSize = 0;
  vSims->nCap = iVar12;
  if (iVar12 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar12 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar10;
  __s_00 = (int *)0x0;
  memset(__s,0,lVar15 * 8);
  iVar10 = pVVar2->nSize;
  iVar12 = iVar10 * 2;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar9 = iVar12;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 != 0) {
    __s_00 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = __s_00;
  pVVar3->nSize = iVar12;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0,(long)iVar10 << 3);
  }
  pVVar4 = Vec_WecPushLevel(p);
  Abc_NtkFinLocalSetup(vPairs,vList,vMap2,pVVar4);
  iVar10 = 0;
  do {
    uVar14 = vCis->nSize;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    uVar11 = uVar14;
    if (uVar14 - 1 < 0xf) {
      uVar11 = 0x10;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = uVar11;
    if (uVar11 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar11 << 2);
    }
    pVVar4->pArray = piVar5;
    if ((int)uVar11 < (int)uVar14) {
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar14 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar14 << 2);
      }
      pVVar4->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = uVar14;
    }
    if (0 < (int)uVar14) {
      piVar5 = pVVar4->pArray;
      uVar8 = 0;
      do {
        piVar5[uVar8] = iVar10;
        uVar8 = uVar8 + 1;
      } while (uVar14 != uVar8);
    }
    pVVar4->nSize = uVar14;
    Abc_NtkFinSimulateOne(pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar4,vSims,nWords,vPairs,p,0,1);
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (int *)0x0;
    }
    free(pVVar4);
    bVar16 = iVar10 == 0;
    iVar10 = iVar10 + 1;
  } while (bVar16);
  uVar14 = p->nSize;
  if ((int)uVar14 < 1) {
    local_e4 = 0;
  }
  else {
    lVar15 = 0;
    local_e4 = 0;
    do {
      if (p->pArray[lVar15].nSize < 1) {
LAB_002b5d17:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pVVar4 = p->pArray + lVar15;
      if (3 < pVVar4->nSize) {
        iVar10 = *pVVar4->pArray;
        uVar14 = iVar10 * 2 + 1;
        uVar13 = 2;
        uVar8 = 3;
        do {
          iVar12 = (int)uVar13;
          if (((iVar12 < 0) || (iVar10 < 0)) || (uVar11 = vPairs->nSize, (int)uVar11 <= iVar10 * 2))
          goto LAB_002b5d17;
          iVar9 = pVVar4->pArray[uVar13];
          iVar7 = pVVar4->pArray[uVar8];
          piVar5 = vPairs->pArray;
          Objs[0] = piVar5[(uint)(iVar10 * 2)];
          if (((iVar9 < 0) ||
              (uVar1 = iVar9 * 2,
              uVar11 == uVar1 || SBORROW4(uVar11,uVar1) != (int)(uVar11 + iVar9 * -2) < 0)) ||
             ((Objs[1] = piVar5[uVar1], (int)uVar11 <= (int)uVar14 ||
              ((Types[0] = piVar5[uVar14], iVar9 < 0 || ((int)uVar11 <= (int)(uVar1 | 1)))))))
          goto LAB_002b5d17;
          Types[1] = piVar5[uVar1 | 1];
          pVVar6 = Abc_NtkFinCheckPair(pNtk,vTypes,vCos,vCis,vNodes,Objs,Types,pVVar3);
          if (pVVar6 == (Vec_Int_t *)0x0) {
            uVar13 = (ulong)(iVar12 + 2);
          }
          else {
            if (pVVar4->nSize <= iVar12) goto LAB_002b5d17;
            if (pVVar4->pArray[uVar13] != iVar9) {
              __assert_fail("Vec_IntEntry(vClass, k) == iFin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                            ,0x3ec,
                            "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                           );
            }
            if (pVVar6->nSize == 0) {
              pVVar4 = Vec_WecPushLevel(p);
              Vec_IntPush(pVVar4,iVar9);
              Vec_IntPush(pVVar4,iVar7);
              if (p->nSize <= lVar15) goto LAB_002b5d36;
              pVVar4 = p->pArray;
              if (pVVar4[lVar15].nSize <= (int)uVar8) {
LAB_002b5d74:
                __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
              }
              iVar7 = pVVar4[lVar15].nSize + -1;
              pVVar4[lVar15].nSize = iVar7;
              if ((int)uVar8 < iVar7) {
                piVar5 = pVVar4[lVar15].pArray + uVar8;
                do {
                  *piVar5 = piVar5[1];
                  uVar11 = (int)uVar8 + 1;
                  uVar8 = (ulong)uVar11;
                  piVar5 = piVar5 + 1;
                } while ((int)uVar11 < pVVar4[lVar15].nSize);
              }
              if (pVVar4[lVar15].nSize <= iVar12) goto LAB_002b5d74;
              iVar7 = pVVar4[lVar15].nSize + -1;
              pVVar4[lVar15].nSize = iVar7;
              if (iVar12 < iVar7) {
                uVar8 = uVar13;
                piVar5 = pVVar4[lVar15].pArray + uVar13;
                do {
                  *piVar5 = piVar5[1];
                  uVar11 = (int)uVar8 + 1;
                  uVar8 = (ulong)uVar11;
                  piVar5 = piVar5 + 1;
                } while ((int)uVar11 < pVVar4[lVar15].nSize);
              }
            }
            else {
              Abc_NtkFinSimulateOne
                        (pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar6,vSims,nWords,vPairs,p,(int)lVar15
                         ,(int)(uVar13 >> 1));
            }
            if (pVVar6->pArray != (int *)0x0) {
              free(pVVar6->pArray);
              pVVar6->pArray = (int *)0x0;
            }
            free(pVVar6);
            if (p->nSize <= lVar15) {
LAB_002b5d36:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            pVVar4 = p->pArray + lVar15;
            if ((iVar12 < p->pArray[lVar15].nSize) && (pVVar4->pArray[uVar13] == iVar9)) {
              __assert_fail("Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                            ,0x3fa,
                            "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                           );
            }
          }
          local_e4 = local_e4 + 1;
          uVar11 = (int)uVar13 + 1;
          uVar8 = (ulong)uVar11;
        } while ((int)uVar11 < pVVar4->nSize);
      }
      lVar15 = lVar15 + 1;
      uVar14 = p->nSize;
    } while (lVar15 < (int)uVar14);
  }
  Abc_NtkFinLocalSetdown(vPairs,vList,vMap2);
  if (0 < (int)uVar14) {
    pVVar4 = p->pArray;
    uVar8 = 0;
    do {
      if ((pVVar4[uVar8].nSize & 1U) != 0) {
        __assert_fail("Vec_IntSize(vArray) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                      ,0x404,
                      "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                     );
      }
      if (2 < pVVar4[uVar8].nSize) {
        pVVar6 = Vec_WecPushLevel(vResult);
        if (1 < pVVar4[uVar8].nSize) {
          lVar15 = 0;
          do {
            Vec_IntPush(pVVar6,pVVar4[uVar8].pArray[lVar15]);
            iVar10 = (int)lVar15;
            lVar15 = lVar15 + 2;
          } while (iVar10 + 3 < pVVar4[uVar8].nSize);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar14);
  }
  iVar10 = p->nCap;
  if (0 < (long)iVar10) {
    pVVar4 = p->pArray;
    lVar15 = 0;
    do {
      __ptr = *(void **)((long)&pVVar4->pArray + lVar15);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar4->pArray + lVar15) = 0;
      }
      lVar15 = lVar15 + 0x10;
    } while ((long)iVar10 * 0x10 != lVar15);
  }
  if (p->pArray != (Vec_Int_t *)0x0) {
    free(p->pArray);
    p->pArray = (Vec_Int_t *)0x0;
  }
  p->nCap = 0;
  p->nSize = 0;
  free(p);
  if (__s != (word *)0x0) {
    free(__s);
    vSims->pArray = (word *)0x0;
  }
  free(vSims);
  if (__s_00 != (int *)0x0) {
    free(__s_00);
    pVVar3->pArray = (int *)0x0;
  }
  free(pVVar3);
  return local_e4;
}

Assistant:

int Abc_NtkFinRefinement( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                          Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Wec_t * vResult )
{
    Vec_Wec_t * vRes  = Vec_WecAlloc( 100 );
    int nWords = Abc_Bit6WordNum( Vec_IntSize(vList) );
    Vec_Wrd_t * vSims = Vec_WrdStart( nWords * Abc_NtkObjNumMax(pNtk) );  // simulation info for each object
    Vec_Int_t * vLits = Vec_IntStart( 2*Abc_NtkObjNumMax(pNtk) );         // two literals for each object
    Vec_Int_t * vPat, * vClass, * vArray;  
    int i, k, iFin, Index, nCalls = 0;
    // prepare
    vArray = Vec_WecPushLevel( vRes );
    Abc_NtkFinLocalSetup( vPairs, vList, vMap2, vArray );
    // try all-0/all-1 pattern
    for ( i = 0; i < 2; i++ )
    {
        vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
        Vec_IntFill( vPat, Vec_IntSize(vCis), i );
        Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, 0, 1 );
        Vec_IntFree( vPat );
    }
    // explore the classes
    //Vec_WecPrint( vRes, 0 );
    Vec_WecForEachLevel( vRes, vClass, i )
    {
        int iFin0  = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryDoubleStart( vClass, iFin, Index, k, 2 )
        {
            int Objs[2]  = { Vec_IntEntry(vPairs, 2*iFin0),   Vec_IntEntry(vPairs, 2*iFin)   }; 
            int Types[2] = { Vec_IntEntry(vPairs, 2*iFin0+1), Vec_IntEntry(vPairs, 2*iFin+1) }; 
            nCalls++;
            //printf( "Checking pair %d and %d.\n", iFin0, iFin );
            vPat = Abc_NtkFinCheckPair( pNtk, vTypes, vCos, vCis, vNodes, Objs, Types, vLits );
            if ( vPat == NULL ) // proved
                continue;
            assert( Vec_IntEntry(vClass, k) == iFin );
            if ( Vec_IntSize(vPat) == 0 )
            {
                Vec_Int_t * vNewClass = Vec_WecPushLevel( vRes );
                Vec_IntPushTwo( vNewClass, iFin, Index );  // index and first entry
                vClass = Vec_WecEntry( vRes, i );
                Vec_IntDrop( vClass, k+1 );
                Vec_IntDrop( vClass, k );
            }
            else // resimulate and refine
                Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, i, k/2 );
            Vec_IntFree( vPat );
            // make sure refinement happened (k'th entry is now absent or different)
            vClass = Vec_WecEntry( vRes, i );
            assert( Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin );
            k -= 2;
            //Vec_WecPrint( vRes, 0 );
        }
    }
    // unprepare
    Abc_NtkFinLocalSetdown( vPairs, vList, vMap2 );
    // reload proved equivs into the final array
    Vec_WecForEachLevel( vRes, vArray, i )
    {
        assert( Vec_IntSize(vArray) % 2 == 0 );
        if ( Vec_IntSize(vArray) <= 2 )
            continue;
        vClass = Vec_WecPushLevel( vResult );
        Vec_IntForEachEntryDouble( vArray, iFin, Index, k )
            Vec_IntPush( vClass, iFin );
    }
    Vec_WecFree( vRes );
    Vec_WrdFree( vSims );
    Vec_IntFree( vLits );
    return nCalls;
}